

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

void __thiscall
duckdb::vector<duckdb::JoinCondition,_true>::erase_at
          (vector<duckdb::JoinCondition,_true> *this,idx_t idx)

{
  pointer pJVar1;
  InternalException *this_00;
  string local_50;
  
  pJVar1 = (this->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (idx <= (ulong)(((long)(this->
                            super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                            ).
                            super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pJVar1 >> 3) *
                    -0x5555555555555555)) {
    ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::_M_erase
              (&this->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
               pJVar1 + idx);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Can\'t remove offset %d from vector of size %d","");
  InternalException::InternalException<unsigned_long,unsigned_long>
            (this_00,&local_50,idx,
             ((long)(this->
                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
                    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->
                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
                    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void erase_at(idx_t idx) { // NOLINT: not using camelcase on purpose here
		if (MemorySafety<SAFE>::ENABLED && idx > original::size()) {
			throw InternalException("Can't remove offset %d from vector of size %d", idx, original::size());
		}
		unsafe_erase_at(idx);
	}